

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbiw__zlib_bitrev(int code,int codebits)

{
  int res;
  int codebits_local;
  int code_local;
  
  res = 0;
  codebits_local = codebits;
  code_local = code;
  while (codebits_local != 0) {
    res = res << 1 | code_local & 1U;
    code_local = code_local >> 1;
    codebits_local = codebits_local + -1;
  }
  return res;
}

Assistant:

static int stbiw__zlib_bitrev(int code, int codebits)
{
   int res=0;
   while (codebits--) {
      res = (res << 1) | (code & 1);
      code >>= 1;
   }
   return res;
}